

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_interp.c
# Opt level: O0

int arkInterpResize_Lagrange
              (ARKodeMem_conflict ark_mem,ARKInterp I,ARKVecResizeFn resize,void *resize_data,
              sunindextype lrw_diff,sunindextype liw_diff,N_Vector y0)

{
  int iVar1;
  ARKodeMem in_RCX;
  long *in_RSI;
  N_Vector *in_RDI;
  ARKVecResizeFn in_R8;
  void *in_R9;
  int i;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar2;
  
  if (in_RSI != (long *)0x0) {
    if (*(long *)(*in_RSI + 8) != 0) {
      for (iVar2 = 0; iVar2 < *(int *)(*in_RSI + 4); iVar2 = iVar2 + 1) {
        iVar1 = arkResizeVec(in_RCX,in_R8,in_R9,CONCAT44(iVar2,in_stack_ffffffffffffffc0),
                             *(long *)(*in_RSI + 8) + (long)iVar2 * 8,(N_Vector)0x14d983,in_RDI);
        if (iVar1 == 0) {
          return -0x14;
        }
      }
    }
    *(undefined4 *)(*in_RSI + 0x18) = 0;
  }
  return 0;
}

Assistant:

int arkInterpResize_Lagrange(ARKodeMem ark_mem, ARKInterp I,
                             ARKVecResizeFn resize, void* resize_data,
                             sunindextype lrw_diff, sunindextype liw_diff,
                             N_Vector y0)
{
  int i;

  /* resize vectors */
  if (I == NULL) { return (ARK_SUCCESS); }
  if (LINT_YHIST(I) != NULL)
  {
    for (i = 0; i < LINT_NMAXALLOC(I); i++)
    {
      if (!arkResizeVec(ark_mem, resize, resize_data, lrw_diff, liw_diff, y0,
                        &(LINT_YJ(I, i))))
      {
        return (ARK_MEM_FAIL);
      }
    }
  }

  /* reset active history length */
  LINT_NHIST(I) = 0;

  return (ARK_SUCCESS);
}